

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_m06l.c
# Opt level: O2

void mgga_x_m06l_init(xc_func_type *p)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = malloc(0x90);
  p->params = pvVar2;
  iVar1 = p->info->number;
  if (iVar1 != 0x131) {
    if (iVar1 == 0x136) {
      xc_hyb_init_sr(p,0.0,0.0);
      return;
    }
    if ((iVar1 != 0x1c1) && (iVar1 != 0x1bc)) {
      return;
    }
  }
  xc_hyb_init_hybrid(p,0.0);
  return;
}

Assistant:

static void
mgga_x_m06l_init(xc_func_type *p)
{
  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(mgga_x_m06l_params));

  switch(p->info->number) {
  case(XC_HYB_MGGA_X_M06):
  case(XC_HYB_MGGA_X_M06_HF):
  case(XC_HYB_MGGA_X_REVM06):
    xc_hyb_init_hybrid(p, 0.0);
    break;

  case(XC_HYB_MGGA_X_M06_SX):
    xc_hyb_init_sr(p, 0.0, 0.0);
    break;
  }
}